

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<true>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  reference ppDVar7;
  const_reference pvVar8;
  char *pcVar9;
  ostream *poVar10;
  Allocator<mecab_node_t,_mecab_path_t> *in_RCX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  mecab_node_t *new_node_6;
  mecab_node_t *new_node_5;
  size_t k_4;
  size_t size_5;
  Token *token_5;
  mecab_node_t *new_node_4;
  size_t k_3;
  size_t size_4;
  Token *token_4;
  mecab_node_t *new_node_3;
  size_t k_2;
  size_t size_3;
  Token *token_3;
  size_t i_1;
  mecab_node_t *new_node_2;
  size_t k_1;
  size_t size_2;
  Token *token_2;
  CharInfo fail;
  char *tmp;
  mecab_node_t *new_node_1;
  size_t k;
  size_t size_1;
  Token *token_1;
  char *group_begin3;
  char *begin3;
  mecab_node_t *new_node;
  size_t j;
  Token *token;
  size_t size;
  size_t i;
  size_t n_1;
  const_iterator it;
  size_t results_size;
  result_type *daresults;
  char *begin2;
  size_t n;
  size_t begin_pos;
  size_t clen;
  size_t mblen;
  mecab_node_t *result_node;
  CharInfo cinfo;
  Token *token_00;
  Dictionary *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  Dictionary *in_stack_fffffffffffffde0;
  size_t *in_stack_fffffffffffffde8;
  mecab_node_t *in_stack_fffffffffffffdf0;
  CharProperty *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  CharProperty *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  CharInfo c;
  size_t *in_stack_fffffffffffffe20;
  long *plVar11;
  char *local_1c8;
  die local_1a1;
  mecab_node_t *local_1a0;
  mecab_node_t *local_198;
  ulong local_190;
  ulong local_188;
  Token *local_180;
  CharInfo local_174;
  mecab_node_t *local_170;
  ulong local_168;
  ulong local_160;
  Token *local_158;
  CharInfo local_14c;
  mecab_node_t *local_148;
  ulong local_140;
  ulong local_138;
  Token *local_130;
  ulong local_128;
  mecab_node_t *local_120;
  ulong local_118;
  ulong local_110;
  Token *local_108;
  CharInfo local_100;
  CharInfo local_fc;
  char *local_f8;
  mecab_node_t *local_f0;
  ulong local_e8;
  ulong local_e0;
  Token *local_d8;
  char *local_d0;
  char *local_c8;
  mecab_node_t *local_c0;
  ulong local_b8;
  Token *local_b0;
  size_t local_a8;
  ulong local_a0;
  ulong local_98;
  Dictionary **local_90;
  __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
  local_88;
  size_t local_80;
  result_type *local_78;
  undefined4 local_6c;
  char *local_68;
  ulong local_60;
  ulong local_58;
  Token local_50;
  mecab_node_t *local_40;
  CharInfo local_34;
  long *local_30;
  Allocator<mecab_node_t,_mecab_path_t> *local_28;
  char *local_20;
  long local_18;
  mecab_node_t *local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  CharInfo::CharInfo(&local_34);
  lVar6 = local_18;
  local_40 = (mecab_node_t *)0x0;
  local_50.feature = 0;
  local_50.compound = 0;
  local_50.lcAttr = 0;
  local_50.rcAttr = 0;
  local_50.posid = 0;
  local_50.wcost = 0;
  if ((ulong)((long)local_20 - local_18) < 0xffff) {
    local_1c8 = local_20;
  }
  else {
    local_1c8 = (char *)(local_18 + 0xffff);
  }
  local_20 = local_1c8;
  lVar4 = (**(code **)(*local_30 + 0x40))();
  local_58 = lVar6 - lVar4;
  local_60 = local_58;
  do {
    local_60 = local_60 + 1;
    uVar1 = local_60;
    uVar5 = (**(code **)(*local_30 + 0x58))();
    if (uVar5 <= uVar1) goto LAB_00133197;
    iVar3 = (**(code **)(*local_30 + 0xf8))(local_30,local_60);
  } while (iVar3 != 1);
  lVar6 = (**(code **)(*local_30 + 0x40))();
  local_20 = (char *)(lVar6 + local_60);
LAB_00133197:
  local_6c = *(undefined4 *)(in_RDI + 0x2f8);
  token_00 = &local_50;
  local_68 = CharProperty::seekToOtherType
                       (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                        (char *)in_stack_fffffffffffffdf8,
                        SUB84((ulong)in_stack_fffffffffffffe10 >> 0x20,0),
                        (CharInfo *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffe20);
  local_78 = Allocator<mecab_node_t,_mecab_path_t>::mutable_results
                       ((Allocator<mecab_node_t,_mecab_path_t> *)0x133200);
  local_80 = Allocator<mecab_node_t,_mecab_path_t>::results_size(local_28);
  local_88._M_current =
       (Dictionary **)
       std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::begin
                 ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)token_00);
  while( true ) {
    local_90 = (Dictionary **)
               std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::end
                         ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
                          token_00);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                        *)token_00);
    c = SUB84((ulong)in_stack_fffffffffffffe10 >> 0x20,0);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
    ::operator*(&local_88);
    local_98 = Dictionary::commonPrefixSearch
                         (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (size_t)in_stack_fffffffffffffdd0,(result_type *)token_00,0x1332a7);
    for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
      ppDVar7 = __gnu_cxx::
                __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                ::operator*(&local_88);
      local_a8 = Dictionary::token_size(*ppDVar7,local_78 + local_a0);
      ppDVar7 = __gnu_cxx::
                __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
                ::operator*(&local_88);
      local_b0 = Dictionary::token(*ppDVar7,local_78 + local_a0);
      for (local_b8 = 0; local_b8 < local_a8; local_b8 = local_b8 + 1) {
        local_c0 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                             ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0);
        __gnu_cxx::
        __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
        ::operator*(&local_88);
        anon_unknown_20::read_node_info(in_stack_fffffffffffffdd0,token_00,(Node **)0x1333a4);
        local_c0->length = (unsigned_short)local_78[local_a0].length;
        local_c0->rlength = ((short)local_68 - (short)local_18) + local_c0->length;
        local_c0->surface = local_68;
        local_c0->stat = '\0';
        local_c0->char_type = (uchar)((uint)local_34 >> 0x12);
        bVar2 = anon_unknown_20::is_valid_node<mecab_node_t>
                          ((Lattice *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        if (bVar2) {
          local_c0->bnext = local_40;
          local_40 = local_c0;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<MeCab::Dictionary_*const_*,_std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>_>
    ::operator++(&local_88);
  }
  if ((local_40 == (mecab_node_t *)0x0) || ((int)local_34 < 0)) {
    local_c8 = local_68 + local_50._8_8_;
    local_d0 = (char *)0x0;
    if (local_20 < local_c8) {
      pvVar8 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
      local_d8 = pvVar8->first;
      pvVar8 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
      local_e0 = pvVar8->second;
      for (local_e8 = 0; c = SUB84((ulong)in_stack_fffffffffffffe10 >> 0x20,0), local_e8 < local_e0;
          local_e8 = local_e8 + 1) {
        local_f0 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                             ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0);
        anon_unknown_20::read_node_info(in_stack_fffffffffffffdd0,token_00,(Node **)0x1335f0);
        local_f0->char_type = (uchar)((uint)local_34 >> 0x12);
        local_f0->surface = local_68;
        local_f0->length = (short)local_c8 - (short)local_68;
        local_f0->rlength = (short)local_c8 - (short)local_18;
        local_f0->stat = '\x01';
        local_f0->bnext = local_40;
        pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
        if (pcVar9 != (char *)0x0) {
          pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          local_f0->feature = pcVar9;
        }
        bVar2 = anon_unknown_20::is_valid_node<mecab_node_t>
                          ((Lattice *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        if (bVar2) {
          local_40 = local_f0;
        }
      }
      if (local_40 != (mecab_node_t *)0x0) {
        return local_40;
      }
    }
    if (((uint)local_34 >> 0x1e & 1) != 0) {
      local_f8 = local_c8;
      CharInfo::CharInfo(&local_fc);
      local_100 = local_34;
      token_00 = &local_50;
      local_c8 = CharProperty::seekToOtherType
                           (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                            (char *)in_stack_fffffffffffffdf8,c,
                            (CharInfo *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                            in_stack_fffffffffffffe20);
      if ((ulong)local_50._0_8_ <= *(ulong *)(in_RDI + 0x4d8)) {
        pvVar8 = std::
                 vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                               *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
        local_108 = pvVar8->first;
        pvVar8 = std::
                 vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                               *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
        local_110 = pvVar8->second;
        for (local_118 = 0; local_118 < local_110; local_118 = local_118 + 1) {
          local_120 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                                ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0)
          ;
          anon_unknown_20::read_node_info(in_stack_fffffffffffffdd0,token_00,(Node **)0x13388f);
          local_120->char_type = (uchar)((uint)local_34 >> 0x12);
          local_120->surface = local_68;
          local_120->length = (short)local_c8 - (short)local_68;
          local_120->rlength = (short)local_c8 - (short)local_18;
          local_120->stat = '\x01';
          local_120->bnext = local_40;
          pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          if (pcVar9 != (char *)0x0) {
            pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
            local_120->feature = pcVar9;
          }
          bVar2 = anon_unknown_20::is_valid_node<mecab_node_t>
                            ((Lattice *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
          if (bVar2) {
            local_40 = local_120;
          }
        }
      }
      local_d0 = local_c8;
      local_c8 = local_f8;
    }
    local_128 = 1;
    while ((local_128 <= ((uint)local_34 >> 0x1a & 0xf) && (local_c8 <= local_20))) {
      if (local_c8 != local_d0) {
        local_50.lcAttr = (undefined2)local_128;
        local_50.rcAttr = local_128._2_2_;
        local_50.posid = local_128._4_2_;
        local_50.wcost = local_128._6_2_;
        pvVar8 = std::
                 vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                               *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
        local_130 = pvVar8->first;
        pvVar8 = std::
                 vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                               *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
        local_138 = pvVar8->second;
        for (local_140 = 0; local_140 < local_138; local_140 = local_140 + 1) {
          local_148 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                                ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0)
          ;
          anon_unknown_20::read_node_info(in_stack_fffffffffffffdd0,token_00,(Node **)0x133aef);
          local_148->char_type = (uchar)((uint)local_34 >> 0x12);
          local_148->surface = local_68;
          local_148->length = (short)local_c8 - (short)local_68;
          local_148->rlength = (short)local_c8 - (short)local_18;
          local_148->stat = '\x01';
          local_148->bnext = local_40;
          pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          if (pcVar9 != (char *)0x0) {
            pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
            local_148->feature = pcVar9;
          }
          bVar2 = anon_unknown_20::is_valid_node<mecab_node_t>
                            ((Lattice *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
          if (bVar2) {
            local_40 = local_148;
          }
        }
        local_14c = CharProperty::getCharInfo
                              (in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                               (char *)in_stack_fffffffffffffde8,(size_t *)in_stack_fffffffffffffde0
                              );
        bVar2 = CharInfo::isKindOf(&local_34,local_14c);
        if (((bVar2 ^ 0xffU) & 1) != 0) break;
        local_c8 = local_c8 + local_50._8_8_;
      }
      local_128 = local_128 + 1;
    }
    if (local_40 == (mecab_node_t *)0x0) {
      pvVar8 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
      local_158 = pvVar8->first;
      pvVar8 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
      local_160 = pvVar8->second;
      for (local_168 = 0; local_168 < local_160; local_168 = local_168 + 1) {
        local_170 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                              ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0);
        anon_unknown_20::read_node_info(in_stack_fffffffffffffdd0,token_00,(Node **)0x133d53);
        local_170->char_type = (uchar)((uint)local_34 >> 0x12);
        local_170->surface = local_68;
        local_170->length = (short)local_c8 - (short)local_68;
        local_170->rlength = (short)local_c8 - (short)local_18;
        local_170->stat = '\x01';
        local_170->bnext = local_40;
        pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
        if (pcVar9 != (char *)0x0) {
          pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          local_170->feature = pcVar9;
        }
        bVar2 = anon_unknown_20::is_valid_node<mecab_node_t>
                          ((Lattice *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        if (bVar2) {
          local_40 = local_170;
        }
      }
    }
    if (local_40 == (mecab_node_t *)0x0) {
      local_c8 = local_68;
      do {
        local_174 = CharProperty::getCharInfo
                              (in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                               (char *)in_stack_fffffffffffffde8,(size_t *)in_stack_fffffffffffffde0
                              );
        pcVar9 = local_c8 + local_50._8_8_;
        local_c8 = pcVar9;
        local_34 = local_174;
        if (local_20 < pcVar9) break;
        plVar11 = local_30;
        lVar6 = (**(code **)(*local_30 + 0x40))();
        iVar3 = (**(code **)(*plVar11 + 0xf8))(plVar11,(long)pcVar9 - lVar6);
      } while (iVar3 == 2);
      pvVar8 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
      local_180 = pvVar8->first;
      pvVar8 = std::
               vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ::operator[]((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                             *)(in_RDI + 0x2d8),(ulong)((uint)local_34 >> 0x12 & 0xff));
      local_188 = pvVar8->second;
      for (local_190 = 0; local_190 < local_188; local_190 = local_190 + 1) {
        local_198 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                              ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0);
        anon_unknown_20::read_node_info(in_stack_fffffffffffffdd0,token_00,(Node **)0x133ffc);
        local_198->char_type = (uchar)((uint)local_34 >> 0x12);
        local_198->surface = local_68;
        local_198->length = (short)local_c8 - (short)local_68;
        local_198->rlength = (short)local_c8 - (short)local_18;
        local_198->stat = '\x01';
        local_198->bnext = local_40;
        pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
        if (pcVar9 != (char *)0x0) {
          pcVar9 = scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x290));
          local_198->feature = pcVar9;
        }
        bVar2 = anon_unknown_20::is_valid_node<mecab_node_t>
                          ((Lattice *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        if (bVar2) {
          local_40 = local_198;
        }
      }
      if (local_40 == (mecab_node_t *)0x0) {
        local_1a0 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                              ((Allocator<mecab_node_t,_mecab_path_t> *)in_stack_fffffffffffffdd0);
        local_1a0->char_type = (uchar)((uint)local_34 >> 0x12);
        local_1a0->surface = local_68;
        local_1a0->length = (short)local_c8 - (short)local_68;
        local_1a0->rlength = (short)local_c8 - (short)local_18;
        local_1a0->stat = '\x01';
        local_1a0->bnext = local_40;
        lVar6 = (**(code **)(*local_30 + 0x40))();
        pcVar9 = (char *)(**(code **)(*local_30 + 0x100))(local_30,local_18 - lVar6);
        local_1a0->feature = pcVar9;
        if (local_1a0->feature == (char *)0x0) {
          die::die(&local_1a1);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,"(");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x171);
          poVar10 = std::operator<<(poVar10,") [");
          poVar10 = std::operator<<(poVar10,"new_node->feature");
          poVar10 = std::operator<<(poVar10,"] ");
          die::operator&(&local_1a1,poVar10);
          die::~die((die *)0x134305);
        }
        local_40 = local_1a0;
      }
    }
    local_8 = local_40;
  }
  else {
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}